

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_fe.cc
# Opt level: O3

Matrix<double,_4,_2,_0,_4,_2> *
lf::uscalfe::LinearFELaplaceElementMatrix::DervRefShapFncts
          (Matrix<double,_4,_2,_0,_4,_2> *__return_storage_ptr__,Vector2d *xh)

{
  double *s;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> *pCVar8;
  Matrix<double,_4,_2,_0,_4,_2> *pMVar9;
  double local_a0;
  Scalar local_98;
  double local_90;
  double local_88;
  double local_80;
  CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> local_78;
  PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_> local_58;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::resize(&local_58,4,2);
  local_58.m_storage.m_data.array[0] =
       (xh->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[1]
       + -1.0;
  local_78.m_row = 0;
  local_78.m_col = 1;
  local_78.m_currentBlockRows = 1;
  local_80 = (xh->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0] + -1.0;
  local_78.m_xpr = (Matrix<double,_4,_2,_0,_4,_2> *)&local_58;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (&local_78,&local_80);
  s = (xh->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array + 1;
  local_88 = 1.0 - *s;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar8,&local_88);
  local_90 = -(xh->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar8,&local_90);
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_(pCVar8,s);
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar8,(Scalar *)xh);
  local_98 = -*s;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar8,&local_98);
  local_a0 = 1.0 - (xh->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array[0];
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::operator_
                     (pCVar8,&local_a0);
  pMVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::finished(pCVar8);
  dVar1 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[0];
  dVar2 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[1];
  dVar3 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[2];
  dVar4 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[3];
  dVar5 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[4];
  dVar6 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[5];
  dVar7 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.
          array[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[6] =
       (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.m_data.array
       [6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[7] = dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[4] = dVar5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[5] = dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[2] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[3] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[0] = dVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>).m_storage.
  m_data.array[1] = dVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_2,_0,_4,_2>_>::finished(&local_78);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 4, 2> LinearFELaplaceElementMatrix::DervRefShapFncts(
    const Eigen::Vector2d &xh) {
  // clang-format off
  return (Eigen::Matrix<double, 4, 2>(4, 2) <<
	  xh[1] - 1, xh[0] - 1,
	  1 - xh[1],  -xh[0]  ,
	  xh[1]    , xh[0]    ,
	  -xh[1]   , 1 - xh[0]
	  ).finished();
  // clang-format on
}